

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result wabt::anon_unknown_1::CheckTypes
                 (Location *loc,TypeVector *actual,TypeVector *expected,char *desc,char *index_kind,
                 Errors *errors)

{
  Enum EVar1;
  Enum EVar2;
  vector<wabt::Error,std::allocator<wabt::Error>> *this;
  Location *__args_1;
  char *pcVar3;
  char *pcVar4;
  pointer pTVar5;
  Enum EVar6;
  pointer pTVar7;
  size_t i;
  ulong uVar8;
  Type local_84;
  ErrorLevel local_80;
  Type local_7c;
  vector<wabt::Error,std::allocator<wabt::Error>> *local_78;
  TypeVector *local_70;
  char *local_68;
  Location *local_60;
  TypeVector *local_58;
  string local_50;
  
  pTVar5 = (actual->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pTVar7 = (actual->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_78 = (vector<wabt::Error,std::allocator<wabt::Error>> *)index_kind;
  local_58 = actual;
  if ((long)pTVar7 - (long)pTVar5 >> 2 ==
      (long)(expected->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(expected->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
            super__Vector_impl_data._M_start >> 2) {
    EVar6 = Ok;
    local_70 = expected;
    local_68 = desc;
    local_60 = loc;
    for (uVar8 = 0; uVar8 < (ulong)((long)pTVar7 - (long)pTVar5 >> 2); uVar8 = uVar8 + 1) {
      EVar1 = pTVar5[uVar8].enum_;
      EVar2 = (expected->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar8].enum_;
      if (EVar1 != EVar2) {
        local_80 = Error;
        local_84.enum_ = EVar1;
        local_7c.enum_ = EVar2;
        pcVar3 = Type::GetName(&local_84);
        pcVar4 = Type::GetName(&local_7c);
        __args_1 = local_60;
        this = local_78;
        StringPrintf_abi_cxx11_
                  (&local_50,"type mismatch for %s %u of %s. got %s, expected %s",local_68,
                   uVar8 & 0xffffffff,"function",pcVar3,pcVar4);
        std::vector<wabt::Error,std::allocator<wabt::Error>>::
        emplace_back<wabt::ErrorLevel,wabt::Location_const&,std::__cxx11::string>
                  (this,&local_80,__args_1,&local_50);
        std::__cxx11::string::_M_dispose();
        pTVar5 = (local_58->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pTVar7 = (local_58->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        expected = local_70;
      }
      EVar6 = (Enum)(EVar6 != Ok || EVar1 != EVar2);
    }
  }
  else {
    local_84.enum_ = ~I64;
    StringPrintf_abi_cxx11_(&local_50,"expected %zd %ss, got %zd");
    std::vector<wabt::Error,std::allocator<wabt::Error>>::
    emplace_back<wabt::ErrorLevel,wabt::Location_const&,std::__cxx11::string>
              (local_78,(ErrorLevel *)&local_84,loc,&local_50);
    std::__cxx11::string::_M_dispose();
    EVar6 = Error;
  }
  return (Result)EVar6;
}

Assistant:

Result CheckTypes(const Location& loc,
                  const TypeVector& actual,
                  const TypeVector& expected,
                  const char* desc,
                  const char* index_kind,
                  Errors* errors) {
  Result result = Result::Ok;
  if (actual.size() == expected.size()) {
    for (size_t i = 0; i < actual.size(); ++i) {
      result |= CheckTypeIndex(loc, actual[i], expected[i], desc, i, index_kind,
                               errors);
    }
  } else {
    errors->emplace_back(
        ErrorLevel::Error, loc,
        StringPrintf("expected %" PRIzd " %ss, got %" PRIzd, expected.size(),
                     index_kind, actual.size()));
    result = Result::Error;
  }
  return result;
}